

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *
parseFunctionInvocationLike<FunctionInvocationExpressionAstNode>
          (optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *parser,TokenType tokenTypeToExpect)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<ExpressionAstNode> *__x;
  TokenType type;
  shared_ptr<FunctionInvocationExpressionAstNode> local_1f0;
  allocator<char> local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [24];
  string local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> arg;
  string local_140 [32];
  undefined1 local_120 [16];
  undefined1 local_110 [24];
  string local_f8 [32];
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  string local_b0 [32];
  Parser local_90;
  allocator<char> local_69;
  string local_68 [32];
  shared_ptr<Token> identifier;
  vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  arguments;
  bool error;
  TokenType tokenTypeToExpect_local;
  Parser *parser_local;
  
  arguments.
  super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  arguments.
  super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = tokenTypeToExpect;
  std::
  vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>::
  vector((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
          *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  TVar1 = arguments.
          super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"Expected an identifier for function invocation",&local_69);
  type = (TokenType)parser;
  Parser::expect((Parser *)&stack0xffffffffffffffb8,type,(bool *)(ulong)TVar1,
                 (string *)
                 ((long)&arguments.
                         super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  Parser::skipWhiteSpace(parser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"Expected left paren for function invocation",
             (allocator<char> *)(local_c8 + 0x17));
  Parser::expect(&local_90,type,(bool *)0x5,
                 (string *)
                 ((long)&arguments.
                         super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x17));
  while( true ) {
    Parser::skipWhiteSpace(parser);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)parser)
    ;
    TokenBuffer::currentToken((TokenBuffer *)local_c8);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_c8);
    if (TVar1 == EndOfFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f8,"Expected a right paren to close function invocation",
                 (allocator<char> *)(local_110 + 0x17));
      Parser::expect((Parser *)local_d8,type,(bool *)0x6,
                     (string *)
                     ((long)&arguments.
                             super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)(local_110 + 0x17));
      std::optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_>::optional
                (__return_storage_ptr__);
      goto LAB_00112508;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)parser)
    ;
    TokenBuffer::currentToken((TokenBuffer *)local_110);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_110);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_110);
    if (TVar1 == RightParen) break;
    Parser::parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_160,parser);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_160);
    if (bVar2) {
      __x = std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                      ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_160);
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::push_back((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                   *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  __x);
    }
    else {
      arguments.
      super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)parser)
    ;
    TokenBuffer::currentToken((TokenBuffer *)local_170);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_170);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_170);
    if (TVar1 == RightParen) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a0,"Expected a right paren to close function invocation",
                 (allocator<char> *)(local_1b8 + 0x17));
      Parser::expect((Parser *)local_180,type,(bool *)0x6,
                     (string *)
                     ((long)&arguments.
                             super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_180);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)(local_1b8 + 0x17));
      local_110._16_4_ = 3;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1d8,"Expected a comma between function arguments",&local_1d9);
      Parser::expect((Parser *)local_1b8,type,(bool *)0x13,
                     (string *)
                     ((long)&arguments.
                             super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      local_110._16_4_ = 0;
    }
    std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_160);
    if (local_110._16_4_ != 0) {
LAB_0011249b:
      if ((arguments.
           super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        std::
        make_shared<FunctionInvocationExpressionAstNode,std::shared_ptr<Token>&,std::vector<std::shared_ptr<ExpressionAstNode>,std::allocator<std::shared_ptr<ExpressionAstNode>>>&>
                  ((shared_ptr<Token> *)&local_1f0,
                   (vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                    *)&stack0xffffffffffffffb8);
        std::optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_>::
        optional<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true>
                  (__return_storage_ptr__,&local_1f0);
        std::shared_ptr<FunctionInvocationExpressionAstNode>::~shared_ptr(&local_1f0);
      }
      else {
        std::optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_>::optional
                  (__return_storage_ptr__);
      }
LAB_00112508:
      local_110._16_4_ = 1;
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffb8);
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::~vector((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                 *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"Expected a right paren to close function invocation",
             (allocator<char> *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  Parser::expect((Parser *)local_120,type,(bool *)0x6,
                 (string *)
                 ((long)&arguments.
                         super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  goto LAB_0011249b;
}

Assistant:

const std::optional<std::shared_ptr<T>> parseFunctionInvocationLike(Parser* parser, TokenType tokenTypeToExpect) {
  bool error = false;
  std::vector<std::shared_ptr<ExpressionAstNode>> arguments;

  auto identifier = parser->expect(tokenTypeToExpect, error,
    "Expected an identifier for function invocation");

  parser->skipWhiteSpace();

  parser->expect(TokenType::LeftParen, error, "Expected left paren for function invocation");

  while (true) {
    parser->skipWhiteSpace();

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      return std::nullopt;
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    auto arg = parser->parseExpression();

    if (!arg) {
      error = true;

    } else {
      arguments.push_back(arg.value());
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    parser->expect(TokenType::Comma, error, "Expected a comma between function arguments");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<T>(identifier, arguments);
}